

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

bool __thiscall
cmComputeLinkInformation::AddLibraryFeature(cmComputeLinkInformation *this,string *feature)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  *this_00;
  cmMakefile *pcVar1;
  pointer pcVar2;
  cmake *pcVar3;
  pointer pBVar4;
  bool bVar5;
  iterator iVar6;
  cmValue cVar7;
  long lVar8;
  string *psVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar10;
  element_type *peVar11;
  undefined8 uVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  undefined1 local_240 [32];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [24];
  _Base_ptr local_1a8;
  undefined1 local_1a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  _Base_ptr local_168;
  undefined1 local_160 [16];
  string featureName;
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &this->LibraryFeatureDescriptors;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
          ::find(&this_00->_M_t,feature);
  if ((_Rb_tree_header *)iVar6._M_node !=
      &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
    return (bool)(char)iVar6._M_node[3]._M_color;
  }
  local_1f8._0_8_ = (element_type *)0x6;
  local_1f8._8_8_ = "CMAKE_";
  local_1e8._0_8_ = (cmLocalGenerator *)0x0;
  local_1e8._16_8_ = (this->LinkLanguage)._M_dataplus._M_p;
  local_1e8._8_8_ = (this->LinkLanguage)._M_string_length;
  local_1e8._24_8_ = 0;
  local_1e8._32_8_ = 0x14;
  local_1c0._0_8_ = (long)"CMAKE_LINK_LIBRARY_USING_" + 5;
  local_1c0._8_8_ = 0;
  local_1a8 = (_Base_ptr)(feature->_M_dataplus)._M_p;
  local_1c0._16_8_ = feature->_M_string_length;
  local_1a0._0_8_ = (pointer)0x0;
  views._M_len = 4;
  views._M_array = (iterator)local_1f8;
  cmCatViews(&featureName,views);
  pcVar1 = this->Makefile;
  local_1f8._0_8_ = featureName._M_string_length;
  local_1f8._8_8_ = featureName._M_dataplus._M_p;
  local_1e8._0_8_ = (cmLocalGenerator *)0x0;
  local_1e8._8_8_ = (cmGlobalGenerator *)0xa;
  local_1e8._16_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
  local_1e8._24_8_ = (undefined1 *)0x0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_1f8;
  cmCatViews((string *)local_240,views_00);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)local_240);
  pcVar2 = local_240 + 0x10;
  pcVar10 = extraout_RDX;
  if ((pointer)local_240._0_8_ != pcVar2) {
    operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
    pcVar10 = extraout_RDX_00;
  }
  if (cVar7.Value == (string *)0x0) {
    local_1f8._0_8_ = &DAT_00000019;
    local_1f8._8_8_ = "CMAKE_LINK_LIBRARY_USING_";
    local_1e8._0_8_ = (cmLocalGenerator *)0x0;
    local_1e8._16_8_ = (feature->_M_dataplus)._M_p;
    local_1e8._8_8_ = feature->_M_string_length;
    local_1e8._24_8_ = 0;
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_1f8;
    cmCatViews((string *)local_240,views_01);
    std::__cxx11::string::operator=((string *)&featureName,(string *)local_240);
    if ((pointer)local_240._0_8_ != pcVar2) {
      operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
    }
    pcVar1 = this->Makefile;
    local_1f8._0_8_ = featureName._M_string_length;
    local_1f8._8_8_ = featureName._M_dataplus._M_p;
    local_1e8._0_8_ = (cmLocalGenerator *)0x0;
    local_1e8._8_8_ = (cmGlobalGenerator *)0xa;
    local_1e8._16_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
    local_1e8._24_8_ = (undefined1 *)0x0;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_1f8;
    cmCatViews((string *)local_240,views_02);
    cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)local_240);
    pcVar10 = extraout_RDX_01;
    if ((pointer)local_240._0_8_ != pcVar2) {
      operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
      pcVar10 = extraout_RDX_02;
    }
  }
  if ((cVar7.Value == (string *)0x0) ||
     (value._M_str = pcVar10, value._M_len = (size_t)((cVar7.Value)->_M_dataplus)._M_p,
     bVar5 = cmValue::IsOn((cmValue *)(cVar7.Value)->_M_string_length,value), !bVar5)) {
    memset(local_1f8,0,0xa8);
    local_1f8._8_8_ = (cmMakefile *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
    local_1e8._32_8_ = 0;
    local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffffffffff00;
    local_1a8 = (_Base_ptr)0x0;
    local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffffffffff00;
    local_1a0._24_8_ = 0;
    local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
    local_168 = (_Base_ptr)0x0;
    local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
    local_1f8._0_8_ = (element_type *)local_1e8;
    local_1e8._24_8_ = local_1c0;
    local_1c0._16_8_ = local_1a0;
    local_1a0._16_8_ = &local_180;
    local_170._M_p = (pointer)local_160;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                *)this_00,feature,(FeatureDescriptor *)local_1f8);
    if ((_Base_ptr)local_170._M_p != (_Base_ptr)local_160) {
      operator_delete(local_170._M_p,local_160._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._16_8_ != &local_180) {
      operator_delete((void *)local_1a0._16_8_,local_180._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1c0._16_8_ != local_1a0) {
      operator_delete((void *)local_1c0._16_8_,(ulong)(local_1a0._0_8_ + 1));
    }
    if ((undefined1 *)local_1e8._24_8_ != local_1c0) {
      operator_delete((void *)local_1e8._24_8_,local_1c0._0_8_ + 1);
    }
    if ((element_type *)local_1f8._0_8_ != (element_type *)local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
    }
    pcVar3 = this->CMakeInstance;
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_1f8._0_8_ = (element_type *)0x9;
    local_1f8._8_8_ = "Feature \'";
    local_1e8._0_8_ = (cmLocalGenerator *)0x0;
    local_1e8._16_8_ = (feature->_M_dataplus)._M_p;
    local_1e8._8_8_ = feature->_M_string_length;
    local_1e8._24_8_ = (undefined1 *)0x0;
    local_1e8._32_8_ = 0x4c;
    local_1c0._0_8_ =
         "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'";
    local_1c0._8_8_ = 0;
    local_1a8 = (_Base_ptr)(psVar9->_M_dataplus)._M_p;
    local_1c0._16_8_ = psVar9->_M_string_length;
    local_1a0._0_8_ = (pointer)0x0;
    local_1a0._8_8_ = (_Base_ptr)0x1d;
    local_1a0._16_8_ = "\', is not supported for the \'";
    local_1a0._24_8_ = 0;
    local_180._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_180._M_allocated_capacity = (this->LinkLanguage)._M_string_length;
    local_170._M_p = (pointer)0x0;
    local_168 = (_Base_ptr)0x10;
    local_160._0_8_ = "\' link language.";
    local_160._8_8_ = (_Base_ptr)0x0;
    views_03._M_len = 7;
    views_03._M_array = (iterator)local_1f8;
    cmCatViews((string *)local_240,views_03);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1f8);
    cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_240,(cmListFileBacktrace *)local_1f8);
  }
  else {
    cVar7 = cmMakefile::GetDefinition(this->Makefile,&featureName);
    if (cVar7.Value != (string *)0x0) {
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1f8);
      cmExpandListWithBacktrace(&items,cVar7.Value,(cmListFileBacktrace *)local_1f8,Yes);
      if ((cmMakefile *)local_1f8._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
      }
      if ((((long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x30) &&
          (bVar5 = anon_unknown.dwarf_1ece785::IsValidFeatureFormat
                             (&(items.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Value), !bVar5)) ||
         (((long)items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x90 &&
          (bVar5 = anon_unknown.dwarf_1ece785::IsValidFeatureFormat
                             (&items.
                               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar5)))) {
        memset(local_1f8,0,0xa8);
        local_1f8._8_8_ = (cmMakefile *)0x0;
        local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
        local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
        local_1e8._32_8_ = 0;
        local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffffffffff00;
        local_1a8 = (_Base_ptr)0x0;
        local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffffffffff00;
        local_1a0._24_8_ = 0;
        local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
        local_168 = (_Base_ptr)0x0;
        local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
        local_1f8._0_8_ = (element_type *)local_1e8;
        local_1e8._24_8_ = local_1c0;
        local_1c0._16_8_ = local_1a0;
        local_1a0._16_8_ = &local_180;
        local_170._M_p = (pointer)local_160;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                    *)this_00,feature,(FeatureDescriptor *)local_1f8);
        if ((_Base_ptr)local_170._M_p != (_Base_ptr)local_160) {
          operator_delete(local_170._M_p,local_160._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._16_8_ != &local_180) {
          operator_delete((void *)local_1a0._16_8_,local_180._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1c0._16_8_ != local_1a0) {
          operator_delete((void *)local_1c0._16_8_,(ulong)(local_1a0._0_8_ + 1));
        }
        if ((undefined1 *)local_1e8._24_8_ != local_1c0) {
          operator_delete((void *)local_1e8._24_8_,local_1c0._0_8_ + 1);
        }
        if ((element_type *)local_1f8._0_8_ != (element_type *)local_1e8) {
          operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
        }
        pcVar3 = this->CMakeInstance;
        psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        local_1f8._0_8_ = (element_type *)0x9;
        local_1f8._8_8_ = "Feature \'";
        local_1e8._0_8_ = (cmLocalGenerator *)0x0;
        local_1e8._16_8_ = (feature->_M_dataplus)._M_p;
        local_1e8._8_8_ = feature->_M_string_length;
        local_1e8._24_8_ = (undefined1 *)0x0;
        local_1e8._32_8_ = 0x1a;
        local_1c0._0_8_ = "\', specified by variable \'";
        local_1c0._8_8_ = 0;
        local_1c0._16_8_ = featureName._M_string_length;
        local_1a8 = (_Base_ptr)featureName._M_dataplus._M_p;
        local_1a0._0_8_ = (pointer)0x0;
        local_1a0._8_8_ = (_Base_ptr)0x76;
        local_1a0._16_8_ =
             "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing) and cannot be used to link target \'"
        ;
        local_1a0._24_8_ = 0;
        local_180._8_8_ = (psVar9->_M_dataplus)._M_p;
        local_180._M_allocated_capacity = psVar9->_M_string_length;
        local_170._M_p = (pointer)0x0;
        local_168 = (_Base_ptr)0x2;
        local_160._0_8_ = (long)"\nmay not start with \'-\'." + 0x16;
        local_160._8_8_ = (_Base_ptr)0x0;
        views_05._M_len = 7;
        views_05._M_array = (iterator)local_1f8;
        cmCatViews((string *)local_240,views_05);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1f8);
        cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_240,(cmListFileBacktrace *)local_1f8)
        ;
joined_r0x004e6643:
        if ((cmMakefile *)local_1f8._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
        }
        peVar11 = (element_type *)local_240._0_8_;
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
LAB_004e6db0:
          operator_delete(peVar11,(ulong)((long)&(((cmLocalGenerator *)local_240._16_8_)->
                                                 super_cmOutputConverter)._vptr_cmOutputConverter +
                                         1));
        }
LAB_004e6db8:
        bVar5 = false;
      }
      else {
        lVar8 = ((long)items.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)items.
                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        if (lVar8 != 3) {
          if (lVar8 == 1) {
            std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(&items,items.
                               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            pBVar4 = items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1f8._0_8_ = (element_type *)local_1e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"PATH{","");
            local_240._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"NAME{","");
            anon_unknown.dwarf_1ece785::FinalizeFeatureFormat
                      (&pBVar4->Value,(string *)local_1f8,(string *)local_240);
            if ((pointer)local_240._0_8_ != pcVar2) {
              operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
            }
            if ((element_type *)local_1f8._0_8_ != (element_type *)local_1e8) {
              operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
            }
            pBVar4 = items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1f8._0_8_ = (element_type *)local_1e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"NAME{","");
            local_240._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"PATH{","");
            anon_unknown.dwarf_1ece785::FinalizeFeatureFormat
                      (&pBVar4[1].Value,(string *)local_1f8,(string *)local_240);
            goto LAB_004e6735;
          }
          memset((FeatureDescriptor *)local_1f8,0,0xa8);
          local_1f8._0_8_ = local_1e8;
          local_1f8._8_8_ = (cmMakefile *)0x0;
          local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
          local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
          local_1e8._24_8_ = local_1c0;
          local_1e8._32_8_ = 0;
          local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffffffffff00;
          local_1c0._16_8_ = local_1a0;
          local_1a8 = (_Base_ptr)0x0;
          local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffffffffff00;
          local_1a0._16_8_ = &local_180;
          local_1a0._24_8_ = 0;
          local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
          local_170._M_p = local_160;
          local_168 = (_Base_ptr)0x0;
          local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(FeatureDescriptor *)local_1f8);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_1f8);
          pcVar3 = this->CMakeInstance;
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string&,char_const(&)[79],std::__cxx11::string_const&,char_const(&)[3]>
                    ((string *)local_1f8,(char (*) [10])"Feature \'",feature,
                     (char (*) [27])"\', specified by variable \'",&featureName,
                     (char (*) [79])
                     "\', is malformed (wrong number of elements) and cannot be used to link target \'"
                     ,psVar9,(char (*) [3])0x8be8aa);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_240);
          cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1f8,
                              (cmListFileBacktrace *)local_240);
joined_r0x004e6a43:
          if ((cmMakefile *)local_240._8_8_ != (cmMakefile *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
          }
          local_240._16_8_ = local_1e8._0_8_;
          peVar11 = (element_type *)local_1f8._0_8_;
          if ((element_type *)local_1f8._0_8_ != (element_type *)local_1e8) goto LAB_004e6db0;
          goto LAB_004e6db8;
        }
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::insert(&items,items.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1,
                 (value_type *)
                 (items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
        pBVar4 = items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1f8._0_8_ = (element_type *)local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"PATH{","");
        local_240._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"NAME{","");
        anon_unknown.dwarf_1ece785::FinalizeFeatureFormat
                  (&pBVar4[1].Value,(string *)local_1f8,(string *)local_240);
        if ((pointer)local_240._0_8_ != pcVar2) {
          operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
        }
        if ((element_type *)local_1f8._0_8_ != (element_type *)local_1e8) {
          operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
        }
        pBVar4 = items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1f8._0_8_ = (element_type *)local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"NAME{","");
        local_240._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"PATH{","");
        anon_unknown.dwarf_1ece785::FinalizeFeatureFormat
                  (&pBVar4[2].Value,(string *)local_1f8,(string *)local_240);
LAB_004e6735:
        if ((pointer)local_240._0_8_ != pcVar2) {
          operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
        }
        if ((element_type *)local_1f8._0_8_ != (element_type *)local_1e8) {
          operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
        }
        if ((((long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
            (bVar5 = anon_unknown.dwarf_1ece785::IsValidFeatureFormat
                               (&(items.
                                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->Value), !bVar5)) ||
           (((long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0xc0 &&
            (bVar5 = anon_unknown.dwarf_1ece785::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar5)))) {
          memset(local_1f8,0,0xa8);
          local_1f8._8_8_ = (cmMakefile *)0x0;
          local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
          local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
          local_1e8._32_8_ = 0;
          local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffffffffff00;
          local_1a8 = (_Base_ptr)0x0;
          local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffffffffff00;
          local_1a0._24_8_ = 0;
          local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
          local_168 = (_Base_ptr)0x0;
          local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
          local_1f8._0_8_ = (element_type *)local_1e8;
          local_1e8._24_8_ = local_1c0;
          local_1c0._16_8_ = local_1a0;
          local_1a0._16_8_ = &local_180;
          local_170._M_p = (pointer)local_160;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(FeatureDescriptor *)local_1f8);
          if ((_Base_ptr)local_170._M_p != (_Base_ptr)local_160) {
            operator_delete(local_170._M_p,local_160._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._16_8_ != &local_180) {
            operator_delete((void *)local_1a0._16_8_,local_180._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1c0._16_8_ != local_1a0) {
            operator_delete((void *)local_1c0._16_8_,(ulong)(local_1a0._0_8_ + 1));
          }
          if ((undefined1 *)local_1e8._24_8_ != local_1c0) {
            operator_delete((void *)local_1e8._24_8_,local_1c0._0_8_ + 1);
          }
          if ((element_type *)local_1f8._0_8_ != (element_type *)local_1e8) {
            operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
          }
          pcVar3 = this->CMakeInstance;
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          local_1f8._0_8_ = (element_type *)0x9;
          local_1f8._8_8_ = "Feature \'";
          local_1e8._0_8_ = (cmLocalGenerator *)0x0;
          local_1e8._16_8_ = (feature->_M_dataplus)._M_p;
          local_1e8._8_8_ = feature->_M_string_length;
          local_1e8._24_8_ = (undefined1 *)0x0;
          local_1e8._32_8_ = 0x1a;
          local_1c0._0_8_ = "\', specified by variable \'";
          local_1c0._8_8_ = 0;
          local_1c0._16_8_ = featureName._M_string_length;
          local_1a8 = (_Base_ptr)featureName._M_dataplus._M_p;
          local_1a0._0_8_ = (pointer)0x0;
          local_1a0._8_8_ = (_Base_ptr)0x8f;
          local_1a0._16_8_ =
               "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"PATH{}\" alternative) and cannot be used to link target \'"
          ;
          local_1a0._24_8_ = 0;
          local_180._8_8_ = (psVar9->_M_dataplus)._M_p;
          local_180._M_allocated_capacity = psVar9->_M_string_length;
          local_170._M_p = (pointer)0x0;
          local_168 = (_Base_ptr)0x2;
          local_160._0_8_ = (long)"\nmay not start with \'-\'." + 0x16;
          local_160._8_8_ = (_Base_ptr)0x0;
          views_06._M_len = 7;
          views_06._M_array = (iterator)local_1f8;
          cmCatViews((string *)local_240,views_06);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1f8);
          cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_240,
                              (cmListFileBacktrace *)local_1f8);
          goto joined_r0x004e6643;
        }
        if ((((long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
            (bVar5 = anon_unknown.dwarf_1ece785::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar5)) ||
           (((long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0xc0 &&
            (bVar5 = anon_unknown.dwarf_1ece785::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2].Value), !bVar5)))) {
          memset((FeatureDescriptor *)local_1f8,0,0xa8);
          local_1f8._0_8_ = local_1e8;
          local_1f8._8_8_ = (cmMakefile *)0x0;
          local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
          local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
          local_1e8._24_8_ = local_1c0;
          local_1e8._32_8_ = 0;
          local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffffffffff00;
          local_1c0._16_8_ = local_1a0;
          local_1a8 = (_Base_ptr)0x0;
          local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffffffffff00;
          local_1a0._16_8_ = &local_180;
          local_1a0._24_8_ = 0;
          local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
          local_170._M_p = local_160;
          local_168 = (_Base_ptr)0x0;
          local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(FeatureDescriptor *)local_1f8);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_1f8);
          pcVar3 = this->CMakeInstance;
          psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string&,char_const(&)[144],std::__cxx11::string_const&,char_const(&)[3]>
                    ((string *)local_1f8,(char (*) [10])"Feature \'",feature,
                     (char (*) [27])"\', specified by variable \'",&featureName,
                     (char (*) [144])
                     "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"NAME{}\" alternative) and cannot be used to link target \'"
                     ,psVar9,(char (*) [3])0x8be8aa);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_240);
          cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1f8,
                              (cmListFileBacktrace *)local_240);
          goto joined_r0x004e6a43;
        }
        cmGeneratorTarget::ResolveLinkerWrapper(this->Target,&items,&this->LinkLanguage,true);
        if ((long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x60) {
          pcVar2 = (feature->_M_dataplus)._M_p;
          local_50._M_allocated_capacity = (size_type)&local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + feature->_M_string_length);
          pcVar2 = ((items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->Value)._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,
                     pcVar2 + ((items.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Value)._M_string_length)
          ;
          pcVar2 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].Value._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar2,
                     pcVar2 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].Value._M_string_length);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    ((LibraryFeatureDescriptor *)local_1f8,(string *)&local_50,&local_70,&local_90);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(LibraryFeatureDescriptor *)local_1f8);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,
                            (ulong)(local_90.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,
                            (ulong)(local_70.field_2._M_allocated_capacity + 1));
          }
          local_b0.field_2._M_allocated_capacity = local_40._M_allocated_capacity;
          uVar12 = local_50._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_allocated_capacity != &local_40) {
LAB_004e6f79:
            operator_delete((void *)uVar12,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pcVar2 = (feature->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar2,pcVar2 + feature->_M_string_length);
          local_130._0_8_ = local_130 + 0x10;
          pcVar2 = ((items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->Value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_130,pcVar2,
                     pcVar2 + ((items.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Value)._M_string_length)
          ;
          pcVar2 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].Value._M_dataplus._M_p;
          local_d0._0_8_ = (_Base_ptr)(local_d0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,pcVar2,
                     pcVar2 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].Value._M_string_length);
          pcVar2 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2].Value._M_dataplus._M_p;
          local_f0._0_8_ = (_Base_ptr)(local_f0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,pcVar2,
                     pcVar2 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2].Value._M_string_length);
          pcVar2 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3].Value._M_dataplus._M_p;
          local_110._0_8_ = (_Base_ptr)(local_110 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_110,pcVar2,
                     pcVar2 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3].Value._M_string_length);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    ((LibraryFeatureDescriptor *)local_1f8,&local_b0,(string *)local_130,
                     (string *)local_d0,(string *)local_f0,(string *)local_110);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,feature,(LibraryFeatureDescriptor *)local_1f8);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_1f8);
          if ((_Base_ptr)local_110._0_8_ != (_Base_ptr)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
          }
          if ((_Base_ptr)local_f0._0_8_ != (_Base_ptr)(local_f0 + 0x10)) {
            operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
          }
          if ((_Base_ptr)local_d0._0_8_ != (_Base_ptr)(local_d0 + 0x10)) {
            operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
          }
          if ((_Base_ptr)local_130._0_8_ != (_Base_ptr)(local_130 + 0x10)) {
            operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
          }
          uVar12 = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_004e6f79;
        }
        bVar5 = true;
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&items);
      goto LAB_004e61bb;
    }
    memset(local_1f8,0,0xa8);
    local_1f8._8_8_ = (cmMakefile *)0x0;
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
    local_1e8._32_8_ = 0;
    local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffffffffff00;
    local_1a8 = (_Base_ptr)0x0;
    local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffffffffff00;
    local_1a0._24_8_ = 0;
    local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
    local_168 = (_Base_ptr)0x0;
    local_160._0_8_ = local_160._0_8_ & 0xffffffffffffff00;
    local_1f8._0_8_ = (element_type *)local_1e8;
    local_1e8._24_8_ = local_1c0;
    local_1c0._16_8_ = local_1a0;
    local_1a0._16_8_ = &local_180;
    local_170._M_p = (pointer)local_160;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                *)this_00,feature,(FeatureDescriptor *)local_1f8);
    if ((_Base_ptr)local_170._M_p != (_Base_ptr)local_160) {
      operator_delete(local_170._M_p,local_160._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._16_8_ != &local_180) {
      operator_delete((void *)local_1a0._16_8_,local_180._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1c0._16_8_ != local_1a0) {
      operator_delete((void *)local_1c0._16_8_,(ulong)(local_1a0._0_8_ + 1));
    }
    if ((undefined1 *)local_1e8._24_8_ != local_1c0) {
      operator_delete((void *)local_1e8._24_8_,local_1c0._0_8_ + 1);
    }
    if ((element_type *)local_1f8._0_8_ != (element_type *)local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
    }
    pcVar3 = this->CMakeInstance;
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_1f8._0_8_ = (element_type *)0x9;
    local_1f8._8_8_ = "Feature \'";
    local_1e8._0_8_ = (cmLocalGenerator *)0x0;
    local_1e8._16_8_ = (feature->_M_dataplus)._M_p;
    local_1e8._8_8_ = feature->_M_string_length;
    local_1e8._24_8_ = (undefined1 *)0x0;
    local_1e8._32_8_ = 0x4c;
    local_1c0._0_8_ =
         "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'";
    local_1c0._8_8_ = 0;
    local_1a8 = (_Base_ptr)(psVar9->_M_dataplus)._M_p;
    local_1c0._16_8_ = psVar9->_M_string_length;
    local_1a0._0_8_ = (pointer)0x0;
    local_1a0._8_8_ = (_Base_ptr)0x1b;
    local_1a0._16_8_ = "\', is not defined for the \'";
    local_1a0._24_8_ = 0;
    local_180._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_180._M_allocated_capacity = (this->LinkLanguage)._M_string_length;
    local_170._M_p = (pointer)0x0;
    local_168 = (_Base_ptr)0x10;
    local_160._0_8_ = "\' link language.";
    local_160._8_8_ = (_Base_ptr)0x0;
    views_04._M_len = 7;
    views_04._M_array = (iterator)local_1f8;
    cmCatViews((string *)local_240,views_04);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1f8);
    cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_240,(cmListFileBacktrace *)local_1f8);
  }
  if ((cmMakefile *)local_1f8._8_8_ != (cmMakefile *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
  }
  bVar5 = false;
LAB_004e61bb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)featureName._M_dataplus._M_p != &featureName.field_2) {
    operator_delete(featureName._M_dataplus._M_p,featureName.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmComputeLinkInformation::AddLibraryFeature(std::string const& feature)
{
  auto it = this->LibraryFeatureDescriptors.find(feature);
  if (it != this->LibraryFeatureDescriptors.end()) {
    return it->second.Supported;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_LIBRARY_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not supported for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not defined for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  auto items = cmExpandListWithBacktrace(
    *langFeature, this->Target->GetBacktrace(), cmList::EmptyElements::Yes);

  if ((items.size() == 1 && !IsValidFeatureFormat(items.front().Value)) ||
      (items.size() == 3 && !IsValidFeatureFormat(items[1].Value))) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing) and cannot be used to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // now, handle possible "PATH{}" and "NAME{}" patterns
  if (items.size() == 1) {
    items.push_back(items.front());
    FinalizeFeatureFormat(items[0].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[1].Value, "NAME{", "PATH{");
  } else if (items.size() == 3) {
    items.insert(items.begin() + 1, items[1]);
    FinalizeFeatureFormat(items[1].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[2].Value, "NAME{", "PATH{");
  } else {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (wrong number of elements) and cannot be used "
               "to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[0].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[1].Value))) {
    // PATH{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"PATH{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[1].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[2].Value))) {
    // NAME{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"NAME{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value });
  } else {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value,
                                items[2].Value, items[3].Value });
  }

  return true;
}